

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O2

error_info *
toml::detail::make_not_found_error<toml::type_config>
          (error_info *__return_storage_ptr__,basic_value<toml::type_config> *v,string *fname,
          key_type *key)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  string *s_00;
  region_type *r;
  string *t;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  locs;
  string title;
  source_location loc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  string local_200 [32];
  enable_if_t<is_std_basic_string<basic_string<char>_>::value,_std::__cxx11::basic_string<char>_>
  local_1e0;
  source_location local_1c0;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_148;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_130;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  source_location local_98;
  
  r = &v->region_;
  source_location::source_location(&local_98,r);
  std::operator+(&local_248,fname,": key \"");
  std::__cxx11::string::string(local_200,key);
  string_conv<std::__cxx11::string,char,std::char_traits<char>,std::allocator<char>>
            (&local_1e0,(detail *)local_200,s);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1c0,
                 &local_248,&local_1e0);
  std::operator+(&local_220,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1c0,
                 "\" not found");
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string(local_200);
  std::__cxx11::string::~string((string *)&local_248);
  local_248.field_2._M_allocated_capacity = 0;
  local_248._M_dataplus._M_p = (pointer)0x0;
  local_248._M_string_length = 0;
  if (local_98.is_ok_ == false) {
    t = &local_b8;
    std::__cxx11::string::string((string *)t,&local_220);
    this = &local_130;
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(this,(vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&local_248);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"",(allocator<char> *)&local_1c0);
    s_00 = &local_d8;
  }
  else {
    if (((local_98.first_line_ == 1) && (local_98.first_column_ == 1)) && (local_98.length_ == 1)) {
      source_location::source_location(&local_1c0,r);
      std::
      vector<std::pair<toml::source_location,std::__cxx11::string>,std::allocator<std::pair<toml::source_location,std::__cxx11::string>>>
      ::emplace_back<toml::source_location,char_const(&)[23]>
                ((vector<std::pair<toml::source_location,std::__cxx11::string>,std::allocator<std::pair<toml::source_location,std::__cxx11::string>>>
                  *)&local_248,&local_1c0,(char (*) [23])"at the top-level table");
    }
    else {
      source_location::source_location(&local_1c0,r);
      std::
      vector<std::pair<toml::source_location,std::__cxx11::string>,std::allocator<std::pair<toml::source_location,std::__cxx11::string>>>
      ::emplace_back<toml::source_location,char_const(&)[14]>
                ((vector<std::pair<toml::source_location,std::__cxx11::string>,std::allocator<std::pair<toml::source_location,std::__cxx11::string>>>
                  *)&local_248,&local_1c0,(char (*) [14])"in this table");
    }
    source_location::~source_location(&local_1c0);
    t = &local_f8;
    std::__cxx11::string::string((string *)t,&local_220);
    this = &local_148;
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(this,(vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&local_248);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"",(allocator<char> *)&local_1c0);
    s_00 = &local_118;
  }
  error_info::error_info(__return_storage_ptr__,t,this,s_00);
  std::__cxx11::string::~string((string *)s_00);
  std::
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(this);
  std::__cxx11::string::~string((string *)t);
  std::
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&local_248);
  std::__cxx11::string::~string((string *)&local_220);
  source_location::~source_location(&local_98);
  return __return_storage_ptr__;
}

Assistant:

error_info make_not_found_error(const basic_value<TC>& v, const std::string& fname, const typename basic_value<TC>::key_type& key)
{
    const auto loc = v.location();
    const std::string title = fname + ": key \"" + string_conv<std::string>(key) + "\" not found";

    std::vector<std::pair<source_location, std::string>> locs;
    if( ! loc.is_ok())
    {
        return error_info(title, locs);
    }

    if(loc.first_line_number() == 1 && loc.first_column_number() == 1 && loc.length() == 1)
    {
        // The top-level table has its region at the 0th character of the file.
        // That means that, in the case when a key is not found in the top-level
        // table, the error message points to the first character. If the file has
        // the first table at the first line, the error message would be like this.
        // ```console
        // [error] key "a" not found
        //  --> example.toml
        //    |
        //  1 | [table]
        //    | ^------ in this table
        // ```
        // It actually points to the top-level table at the first character, not
        // `[table]`. But it is too confusing. To avoid the confusion, the error
        // message should explicitly say "key not found in the top-level table".
        locs.emplace_back(v.location(), "at the top-level table");
    }
    else
    {
        locs.emplace_back(v.location(), "in this table");
    }
    return error_info(title, locs);
}